

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

void Saig_BmcLoadCnf(Saig_Bmc_t *p,Cnf_Dat_t *pCnf)

{
  Aig_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  int VarNumNew;
  int VarNumOld;
  int Lits [2];
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnf_local;
  Saig_Bmc_t *p_local;
  
  Lits[0] = 0;
  do {
    iVar2 = Lits[0];
    iVar1 = Vec_IntSize(p->vVisited);
    if (iVar1 <= iVar2) {
      Lits[0] = 0;
      while ((Lits[0] < pCnf->nClauses &&
             (iVar2 = sat_solver_addclause
                                (p->pSat,pCnf->pClauses[Lits[0]],pCnf->pClauses[Lits[0] + 1]),
             iVar2 != 0))) {
        Lits[0] = Lits[0] + 1;
      }
      if (Lits[0] < pCnf->nClauses) {
        printf("SAT solver became UNSAT after adding clauses.\n");
      }
      return;
    }
    p_00 = p->pFrm;
    iVar2 = Vec_IntEntry(p->vVisited,Lits[0]);
    pObj_00 = Aig_ManObj(p_00,iVar2);
    unique0x00012000 = (pObj_00->field_5).pData;
    (pObj_00->field_5).pData = (void *)0x0;
    iVar2 = pCnf->pVarNums[*(int *)((long)unique0x00012000 + 0x24)];
    if (iVar2 != -1) {
      iVar1 = Saig_BmcSatNum(p,pObj_00);
      if (iVar1 == 0) {
        Saig_BmcSetSatNum(p,pObj_00,iVar2);
      }
      else {
        VarNumNew = toLitCond(iVar1,0);
        VarNumOld = toLitCond(iVar2,1);
        iVar3 = sat_solver_addclause(p->pSat,&VarNumNew,Lits);
        if (iVar3 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                        ,0x243,"void Saig_BmcLoadCnf(Saig_Bmc_t *, Cnf_Dat_t *)");
        }
        VarNumNew = toLitCond(iVar1,1);
        VarNumOld = toLitCond(iVar2,0);
        iVar2 = sat_solver_addclause(p->pSat,&VarNumNew,Lits);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                        ,0x247,"void Saig_BmcLoadCnf(Saig_Bmc_t *, Cnf_Dat_t *)");
        }
      }
    }
    Lits[0] = Lits[0] + 1;
  } while( true );
}

Assistant:

void Saig_BmcLoadCnf( Saig_Bmc_t * p, Cnf_Dat_t * pCnf )
{
    Aig_Obj_t * pObj, * pObjNew;
    int i, Lits[2], VarNumOld, VarNumNew;
    Aig_ManForEachObjVec( p->vVisited, p->pFrm, pObj, i )
    {
        // get the new variable of this node
        pObjNew     = (Aig_Obj_t *)pObj->pData;
        pObj->pData = NULL;
        VarNumNew   = pCnf->pVarNums[ pObjNew->Id ];
        if ( VarNumNew == -1 )
            continue;
        // get the old variable of this node
        VarNumOld   = Saig_BmcSatNum( p, pObj );
        if ( VarNumOld == 0 )
        {
            Saig_BmcSetSatNum( p, pObj, VarNumNew );
            continue;
        }
        // add clauses connecting existing variables
        Lits[0] = toLitCond( VarNumOld, 0 );
        Lits[1] = toLitCond( VarNumNew, 1 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( VarNumOld, 1 );
        Lits[1] = toLitCond( VarNumNew, 0 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // add CNF to the SAT solver
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( p->pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            break;
    if ( i < pCnf->nClauses )
        printf( "SAT solver became UNSAT after adding clauses.\n" );
}